

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  string *psVar1;
  byte bVar2;
  bool bVar3;
  ArrayIndex AVar4;
  size_t sVar5;
  Value *pVVar6;
  Value *pVVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  LargestUInt value_00;
  LargestInt value_01;
  pointer pbVar11;
  char *pcVar12;
  char cVar13;
  ArrayIndex index;
  Json *pJVar14;
  bool bVar15;
  double value_02;
  Members members;
  string local_68;
  Members local_48;
  
  bVar2 = (byte)*(ushort *)&value->field_0x8;
  if (7 < bVar2) {
    return;
  }
  iVar10 = 0x121c2c;
  lVar9 = (long)&switchD_00117a91::switchdataD_00121c2c +
          (long)(int)(&switchD_00117a91::switchdataD_00121c2c)[bVar2];
  uVar8 = (uint)lVar9;
  switch(bVar2) {
  case 0:
    if (this->dropNullPlaceholders_ != false) {
      return;
    }
    std::__cxx11::string::append((char *)&this->document_);
    return;
  case 1:
    pJVar14 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar14,value_01);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 2:
    pJVar14 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar14,value_00);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 3:
    value_02 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_68,(Json *)0x0,value_02,true,uVar8);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 4:
    bVar3 = bVar2 == 4;
    uVar8 = (uint)CONCAT71((int7)((ulong)lVar9 >> 8),bVar3);
    pJVar14 = (Json *)(value->value_).string_;
    bVar15 = pJVar14 == (Json *)0x0;
    if (!bVar15 && bVar3) {
      if ((*(ushort *)&value->field_0x8 >> 8 & 1) == 0) {
        sVar5 = strlen((char *)pJVar14);
        iVar10 = (int)sVar5;
      }
      else {
        iVar10 = *(int *)pJVar14;
        pJVar14 = pJVar14 + 4;
      }
      iVar10 = iVar10 + (int)pJVar14;
    }
    if (bVar15 || !bVar3) {
      return;
    }
    valueToQuotedStringN_abi_cxx11_
              (&local_68,pJVar14,(char *)(ulong)(uint)(iVar10 - (int)pJVar14),uVar8);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 5:
    bVar3 = Value::asBool(value);
    pcVar12 = "false";
    if (bVar3) {
      pcVar12 = "true";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar12,pcVar12 + ((ulong)bVar3 ^ 5));
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_00117d7c;
  case 6:
    cVar13 = (char)this + '\b';
    std::__cxx11::string::push_back(cVar13);
    AVar4 = Value::size(value);
    if (AVar4 != 0) {
      index = 0;
      do {
        if (index != 0) {
          std::__cxx11::string::push_back(cVar13);
        }
        pVVar7 = Value::operator[](value,index);
        writeValue(this,pVVar7);
        index = index + 1;
      } while (AVar4 != index);
    }
    std::__cxx11::string::push_back(cVar13);
    return;
  case 7:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    psVar1 = &this->document_;
    cVar13 = (char)psVar1;
    std::__cxx11::string::push_back(cVar13);
    pbVar11 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (pbVar11 !=
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::push_back(cVar13);
        }
        valueToQuotedStringN_abi_cxx11_
                  (&local_68,(Json *)(pbVar11->_M_dataplus)._M_p,
                   (char *)(ulong)(uint)pbVar11->_M_string_length,(uint)lVar9);
        std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)psVar1);
        pcVar12 = (pbVar11->_M_dataplus)._M_p;
        pVVar6 = Value::find(value,pcVar12,pcVar12 + pbVar11->_M_string_length);
        pVVar7 = (Value *)kNull;
        if (pVVar6 != (Value *)0x0) {
          pVVar7 = pVVar6;
        }
        writeValue(this,pVVar7);
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 !=
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::push_back(cVar13);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    return;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_00117d7c:
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FastWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    if (!dropNullPlaceholders_)
      document_ += "null";
    break;
  case intValue:
    document_ += valueToString(value.asLargestInt());
    break;
  case uintValue:
    document_ += valueToString(value.asLargestUInt());
    break;
  case realValue:
    document_ += valueToString(value.asDouble());
    break;
  case stringValue:
  {
    // Is NULL possible for value.string_?
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok) document_ += valueToQuotedStringN(str, static_cast<unsigned>(end-str));
    break;
  }
  case booleanValue:
    document_ += valueToString(value.asBool());
    break;
  case arrayValue: {
    document_ += '[';
    ArrayIndex size = value.size();
    for (ArrayIndex index = 0; index < size; ++index) {
      if (index > 0)
        document_ += ',';
      writeValue(value[index]);
    }
    document_ += ']';
  } break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    document_ += '{';
    for (Value::Members::iterator it = members.begin(); it != members.end();
         ++it) {
      const JSONCPP_STRING& name = *it;
      if (it != members.begin())
        document_ += ',';
      document_ += valueToQuotedStringN(name.data(), static_cast<unsigned>(name.length()));
      document_ += yamlCompatiblityEnabled_ ? ": " : ":";
      writeValue(value[name]);
    }
    document_ += '}';
  } break;
  }
}